

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

int pnga_register_type(size_t bytes)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 0x11;
  lVar1 = 0x110;
  do {
    if (*(int *)((long)&ga_types[0].active + lVar1) != 1) goto LAB_0016d3cc;
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x1000);
  uVar2 = 0x100;
LAB_0016d3cc:
  iVar3 = -1;
  if (uVar2 != 0x100) {
    ga_types[uVar2].active = 1;
    ga_types[uVar2].size = bytes;
    iVar3 = uVar2 + 1000;
  }
  return iVar3;
}

Assistant:

int pnga_register_type(size_t bytes) {
  int i;
  for(i=GA_TYPES_RESERVED; i<GA_TYPES_MAX && ga_types[i].active==1; i++);
  if(i==GA_TYPES_MAX) {
    return -1;
  }
  ga_types[i].active = 1;
  ga_types[i].size = bytes;
  return i+MT_BASE;
}